

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O2

void BYTE_OUT1IR(dill_stream s,int rex,int insn1,int imm32)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  int tmp;
  
  bVar2 = (byte)insn1;
  pbVar1 = (byte *)s->p->cur_ip;
  if (s->p->code_limit <= pbVar1) {
    extend_dill_stream(s);
    pbVar1 = (byte *)s->p->cur_ip;
  }
  if (rex == 0) {
    lVar3 = 1;
  }
  else {
    pbVar1[1] = bVar2;
    lVar3 = 2;
    bVar2 = (byte)rex | 0x40;
  }
  *(int *)(pbVar1 + lVar3) = imm32;
  *pbVar1 = bVar2;
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  s->p->cur_ip = s->p->cur_ip + (6 - (ulong)(rex == 0));
  return;
}

Assistant:

static void
BYTE_OUT1IR(dill_stream s, int rex, int insn1, int imm32)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        int tmp = imm32;
        *tmp_ip = (unsigned char)rex | 0x40;
        *(tmp_ip + 1) = (unsigned char)insn1;
        memcpy(tmp_ip + 2, &tmp, 4);
    } else {
        int tmp = imm32;
        *(tmp_ip) = (unsigned char)insn1;
        memcpy(tmp_ip + 1, &tmp, 4);
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 5;
    if (rex != 0)
        s->p->cur_ip++;
}